

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_api_json_autogen.cpp
# Opt level: O0

void cfd::api::json::ElementsDecodeLockingScript::CollectFieldName(void)

{
  bool bVar1;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeLockingScript>_>_>,_bool>
  pVar2;
  CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeLockingScript> func_table;
  CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeLockingScript> *in_stack_fffffffffffff748;
  CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeLockingScript> *in_stack_fffffffffffff750;
  CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeLockingScript> *this;
  char (*in_stack_fffffffffffff758) [15];
  char (*__args) [17];
  function<void_(cfd::api::json::ElementsDecodeLockingScript_&,_const_UniValue_&)>
  *in_stack_fffffffffffff760;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeLockingScript>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeLockingScript>_>_>_>
  *this_00;
  undefined1 local_6f1 [49];
  char local_6c0 [103];
  allocator local_659;
  string local_658 [32];
  _Base_ptr local_638;
  undefined1 local_630;
  allocator local_5c1;
  string local_5c0 [32];
  _Base_ptr local_5a0;
  undefined1 local_598;
  allocator local_529;
  string local_528 [32];
  _Base_ptr local_508;
  undefined1 local_500;
  allocator local_491;
  string local_490 [32];
  _Base_ptr local_470;
  undefined1 local_468;
  allocator local_3f9;
  string local_3f8 [32];
  _Base_ptr local_3d8;
  undefined1 local_3d0;
  allocator local_361;
  string local_360 [32];
  _Base_ptr local_340;
  undefined1 local_338;
  allocator local_2c9;
  string local_2c8 [32];
  _Base_ptr local_2a8;
  undefined1 local_2a0;
  allocator local_231;
  string local_230 [32];
  _Base_ptr local_210;
  undefined1 local_208;
  allocator local_199;
  string local_198 [32];
  _Base_ptr local_178;
  undefined1 local_170;
  allocator local_101;
  string local_100 [32];
  _Base_ptr local_e0;
  undefined1 local_d8;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeLockingScript>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeLockingScript>_>_>_>
  local_60 [2];
  
  bVar1 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeLockingScript>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeLockingScript>_>_>_>
          ::empty((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeLockingScript>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeLockingScript>_>_>_>
                   *)0x4a4363);
  if (bVar1) {
    core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeLockingScript>::CLASS_FUNCTION_TABLE
              (in_stack_fffffffffffff750);
    std::function<std::__cxx11::string(cfd::api::json::ElementsDecodeLockingScript_const&)>::
    function<std::__cxx11::string(&)(cfd::api::json::ElementsDecodeLockingScript_const&),void>
              ((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_cfd::api::json::ElementsDecodeLockingScript_&)>
                *)in_stack_fffffffffffff760,
               (_func_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_ElementsDecodeLockingScript_ptr
                *)in_stack_fffffffffffff758);
    std::function<void(cfd::api::json::ElementsDecodeLockingScript&,UniValue_const&)>::
    function<void(&)(cfd::api::json::ElementsDecodeLockingScript&,UniValue_const&),void>
              (in_stack_fffffffffffff760,
               (_func_void_ElementsDecodeLockingScript_ptr_UniValue_ptr *)in_stack_fffffffffffff758)
    ;
    std::function<std::__cxx11::string()>::function<std::__cxx11::string(&)(),void>
              ((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
                *)in_stack_fffffffffffff760,
               (_func_basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff758);
    core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeLockingScript>::operator=
              (in_stack_fffffffffffff750,in_stack_fffffffffffff748);
    core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeLockingScript>::~CLASS_FUNCTION_TABLE
              (in_stack_fffffffffffff750);
    pVar2 = std::
            map<std::__cxx11::string,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeLockingScript>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeLockingScript>>>>
            ::
            emplace<char_const(&)[4],cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeLockingScript>&>
                      ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeLockingScript>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeLockingScript>_>_>_>
                        *)in_stack_fffffffffffff760,(char (*) [4])in_stack_fffffffffffff758,
                       in_stack_fffffffffffff750);
    local_e0 = (_Base_ptr)pVar2.first._M_node;
    local_d8 = pVar2.second;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_100,"asm",&local_101);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)in_stack_fffffffffffff750,(value_type *)in_stack_fffffffffffff748);
    std::__cxx11::string::~string(local_100);
    std::allocator<char>::~allocator((allocator<char> *)&local_101);
    std::function<std::__cxx11::string(cfd::api::json::ElementsDecodeLockingScript_const&)>::
    function<std::__cxx11::string(&)(cfd::api::json::ElementsDecodeLockingScript_const&),void>
              ((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_cfd::api::json::ElementsDecodeLockingScript_&)>
                *)in_stack_fffffffffffff760,
               (_func_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_ElementsDecodeLockingScript_ptr
                *)in_stack_fffffffffffff758);
    std::function<void(cfd::api::json::ElementsDecodeLockingScript&,UniValue_const&)>::
    function<void(&)(cfd::api::json::ElementsDecodeLockingScript&,UniValue_const&),void>
              (in_stack_fffffffffffff760,
               (_func_void_ElementsDecodeLockingScript_ptr_UniValue_ptr *)in_stack_fffffffffffff758)
    ;
    std::function<std::__cxx11::string()>::function<std::__cxx11::string(&)(),void>
              ((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
                *)in_stack_fffffffffffff760,
               (_func_basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff758);
    core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeLockingScript>::operator=
              (in_stack_fffffffffffff750,in_stack_fffffffffffff748);
    core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeLockingScript>::~CLASS_FUNCTION_TABLE
              (in_stack_fffffffffffff750);
    pVar2 = std::
            map<std::__cxx11::string,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeLockingScript>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeLockingScript>>>>
            ::
            emplace<char_const(&)[4],cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeLockingScript>&>
                      ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeLockingScript>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeLockingScript>_>_>_>
                        *)in_stack_fffffffffffff760,(char (*) [4])in_stack_fffffffffffff758,
                       in_stack_fffffffffffff750);
    local_178 = (_Base_ptr)pVar2.first._M_node;
    local_170 = pVar2.second;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_198,"hex",&local_199);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)in_stack_fffffffffffff750,(value_type *)in_stack_fffffffffffff748);
    std::__cxx11::string::~string(local_198);
    std::allocator<char>::~allocator((allocator<char> *)&local_199);
    std::function<std::__cxx11::string(cfd::api::json::ElementsDecodeLockingScript_const&)>::
    function<std::__cxx11::string(&)(cfd::api::json::ElementsDecodeLockingScript_const&),void>
              ((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_cfd::api::json::ElementsDecodeLockingScript_&)>
                *)in_stack_fffffffffffff760,
               (_func_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_ElementsDecodeLockingScript_ptr
                *)in_stack_fffffffffffff758);
    std::function<void(cfd::api::json::ElementsDecodeLockingScript&,UniValue_const&)>::
    function<void(&)(cfd::api::json::ElementsDecodeLockingScript&,UniValue_const&),void>
              (in_stack_fffffffffffff760,
               (_func_void_ElementsDecodeLockingScript_ptr_UniValue_ptr *)in_stack_fffffffffffff758)
    ;
    std::function<std::__cxx11::string()>::function<std::__cxx11::string(&)(),void>
              ((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
                *)in_stack_fffffffffffff760,
               (_func_basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff758);
    core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeLockingScript>::operator=
              (in_stack_fffffffffffff750,in_stack_fffffffffffff748);
    core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeLockingScript>::~CLASS_FUNCTION_TABLE
              (in_stack_fffffffffffff750);
    pVar2 = std::
            map<std::__cxx11::string,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeLockingScript>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeLockingScript>>>>
            ::
            emplace<char_const(&)[8],cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeLockingScript>&>
                      ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeLockingScript>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeLockingScript>_>_>_>
                        *)in_stack_fffffffffffff760,(char (*) [8])in_stack_fffffffffffff758,
                       in_stack_fffffffffffff750);
    local_210 = (_Base_ptr)pVar2.first._M_node;
    local_208 = pVar2.second;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_230,"reqSigs",&local_231);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)in_stack_fffffffffffff750,(value_type *)in_stack_fffffffffffff748);
    std::__cxx11::string::~string(local_230);
    std::allocator<char>::~allocator((allocator<char> *)&local_231);
    std::function<std::__cxx11::string(cfd::api::json::ElementsDecodeLockingScript_const&)>::
    function<std::__cxx11::string(&)(cfd::api::json::ElementsDecodeLockingScript_const&),void>
              ((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_cfd::api::json::ElementsDecodeLockingScript_&)>
                *)in_stack_fffffffffffff760,
               (_func_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_ElementsDecodeLockingScript_ptr
                *)in_stack_fffffffffffff758);
    std::function<void(cfd::api::json::ElementsDecodeLockingScript&,UniValue_const&)>::
    function<void(&)(cfd::api::json::ElementsDecodeLockingScript&,UniValue_const&),void>
              (in_stack_fffffffffffff760,
               (_func_void_ElementsDecodeLockingScript_ptr_UniValue_ptr *)in_stack_fffffffffffff758)
    ;
    std::function<std::__cxx11::string()>::function<std::__cxx11::string(&)(),void>
              ((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
                *)in_stack_fffffffffffff760,
               (_func_basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff758);
    core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeLockingScript>::operator=
              (in_stack_fffffffffffff750,in_stack_fffffffffffff748);
    core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeLockingScript>::~CLASS_FUNCTION_TABLE
              (in_stack_fffffffffffff750);
    pVar2 = std::
            map<std::__cxx11::string,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeLockingScript>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeLockingScript>>>>
            ::
            emplace<char_const(&)[5],cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeLockingScript>&>
                      ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeLockingScript>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeLockingScript>_>_>_>
                        *)in_stack_fffffffffffff760,(char (*) [5])in_stack_fffffffffffff758,
                       in_stack_fffffffffffff750);
    local_2a8 = (_Base_ptr)pVar2.first._M_node;
    local_2a0 = pVar2.second;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_2c8,"type",&local_2c9);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)in_stack_fffffffffffff750,(value_type *)in_stack_fffffffffffff748);
    std::__cxx11::string::~string(local_2c8);
    std::allocator<char>::~allocator((allocator<char> *)&local_2c9);
    std::function<std::__cxx11::string(cfd::api::json::ElementsDecodeLockingScript_const&)>::
    function<std::__cxx11::string(&)(cfd::api::json::ElementsDecodeLockingScript_const&),void>
              ((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_cfd::api::json::ElementsDecodeLockingScript_&)>
                *)in_stack_fffffffffffff760,
               (_func_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_ElementsDecodeLockingScript_ptr
                *)in_stack_fffffffffffff758);
    std::function<void(cfd::api::json::ElementsDecodeLockingScript&,UniValue_const&)>::
    function<void(&)(cfd::api::json::ElementsDecodeLockingScript&,UniValue_const&),void>
              (in_stack_fffffffffffff760,
               (_func_void_ElementsDecodeLockingScript_ptr_UniValue_ptr *)in_stack_fffffffffffff758)
    ;
    std::function<std::__cxx11::string()>::function<std::__cxx11::string(&)(),void>
              ((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
                *)in_stack_fffffffffffff760,
               (_func_basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff758);
    core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeLockingScript>::operator=
              (in_stack_fffffffffffff750,in_stack_fffffffffffff748);
    core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeLockingScript>::~CLASS_FUNCTION_TABLE
              (in_stack_fffffffffffff750);
    pVar2 = std::
            map<std::__cxx11::string,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeLockingScript>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeLockingScript>>>>
            ::
            emplace<char_const(&)[10],cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeLockingScript>&>
                      ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeLockingScript>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeLockingScript>_>_>_>
                        *)in_stack_fffffffffffff760,(char (*) [10])in_stack_fffffffffffff758,
                       in_stack_fffffffffffff750);
    local_340 = (_Base_ptr)pVar2.first._M_node;
    local_338 = pVar2.second;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_360,"addresses",&local_361);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)in_stack_fffffffffffff750,(value_type *)in_stack_fffffffffffff748);
    std::__cxx11::string::~string(local_360);
    std::allocator<char>::~allocator((allocator<char> *)&local_361);
    std::function<std::__cxx11::string(cfd::api::json::ElementsDecodeLockingScript_const&)>::
    function<std::__cxx11::string(&)(cfd::api::json::ElementsDecodeLockingScript_const&),void>
              ((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_cfd::api::json::ElementsDecodeLockingScript_&)>
                *)in_stack_fffffffffffff760,
               (_func_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_ElementsDecodeLockingScript_ptr
                *)in_stack_fffffffffffff758);
    std::function<void(cfd::api::json::ElementsDecodeLockingScript&,UniValue_const&)>::
    function<void(&)(cfd::api::json::ElementsDecodeLockingScript&,UniValue_const&),void>
              (in_stack_fffffffffffff760,
               (_func_void_ElementsDecodeLockingScript_ptr_UniValue_ptr *)in_stack_fffffffffffff758)
    ;
    std::function<std::__cxx11::string()>::function<std::__cxx11::string(&)(),void>
              ((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
                *)in_stack_fffffffffffff760,
               (_func_basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff758);
    core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeLockingScript>::operator=
              (in_stack_fffffffffffff750,in_stack_fffffffffffff748);
    core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeLockingScript>::~CLASS_FUNCTION_TABLE
              (in_stack_fffffffffffff750);
    pVar2 = std::
            map<std::__cxx11::string,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeLockingScript>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeLockingScript>>>>
            ::
            emplace<char_const(&)[13],cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeLockingScript>&>
                      ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeLockingScript>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeLockingScript>_>_>_>
                        *)in_stack_fffffffffffff760,(char (*) [13])in_stack_fffffffffffff758,
                       in_stack_fffffffffffff750);
    local_3d8 = (_Base_ptr)pVar2.first._M_node;
    local_3d0 = pVar2.second;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_3f8,"pegout_chain",&local_3f9);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)in_stack_fffffffffffff750,(value_type *)in_stack_fffffffffffff748);
    std::__cxx11::string::~string(local_3f8);
    std::allocator<char>::~allocator((allocator<char> *)&local_3f9);
    std::function<std::__cxx11::string(cfd::api::json::ElementsDecodeLockingScript_const&)>::
    function<std::__cxx11::string(&)(cfd::api::json::ElementsDecodeLockingScript_const&),void>
              ((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_cfd::api::json::ElementsDecodeLockingScript_&)>
                *)in_stack_fffffffffffff760,
               (_func_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_ElementsDecodeLockingScript_ptr
                *)in_stack_fffffffffffff758);
    std::function<void(cfd::api::json::ElementsDecodeLockingScript&,UniValue_const&)>::
    function<void(&)(cfd::api::json::ElementsDecodeLockingScript&,UniValue_const&),void>
              (in_stack_fffffffffffff760,
               (_func_void_ElementsDecodeLockingScript_ptr_UniValue_ptr *)in_stack_fffffffffffff758)
    ;
    std::function<std::__cxx11::string()>::function<std::__cxx11::string(&)(),void>
              ((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
                *)in_stack_fffffffffffff760,
               (_func_basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff758);
    core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeLockingScript>::operator=
              (in_stack_fffffffffffff750,in_stack_fffffffffffff748);
    core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeLockingScript>::~CLASS_FUNCTION_TABLE
              (in_stack_fffffffffffff750);
    pVar2 = std::
            map<std::__cxx11::string,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeLockingScript>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeLockingScript>>>>
            ::
            emplace<char_const(&)[11],cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeLockingScript>&>
                      ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeLockingScript>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeLockingScript>_>_>_>
                        *)in_stack_fffffffffffff760,(char (*) [11])in_stack_fffffffffffff758,
                       in_stack_fffffffffffff750);
    local_470 = (_Base_ptr)pVar2.first._M_node;
    local_468 = pVar2.second;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_490,"pegout_asm",&local_491);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)in_stack_fffffffffffff750,(value_type *)in_stack_fffffffffffff748);
    std::__cxx11::string::~string(local_490);
    std::allocator<char>::~allocator((allocator<char> *)&local_491);
    std::function<std::__cxx11::string(cfd::api::json::ElementsDecodeLockingScript_const&)>::
    function<std::__cxx11::string(&)(cfd::api::json::ElementsDecodeLockingScript_const&),void>
              ((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_cfd::api::json::ElementsDecodeLockingScript_&)>
                *)in_stack_fffffffffffff760,
               (_func_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_ElementsDecodeLockingScript_ptr
                *)in_stack_fffffffffffff758);
    std::function<void(cfd::api::json::ElementsDecodeLockingScript&,UniValue_const&)>::
    function<void(&)(cfd::api::json::ElementsDecodeLockingScript&,UniValue_const&),void>
              (in_stack_fffffffffffff760,
               (_func_void_ElementsDecodeLockingScript_ptr_UniValue_ptr *)in_stack_fffffffffffff758)
    ;
    std::function<std::__cxx11::string()>::function<std::__cxx11::string(&)(),void>
              ((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
                *)in_stack_fffffffffffff760,
               (_func_basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff758);
    core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeLockingScript>::operator=
              (in_stack_fffffffffffff750,in_stack_fffffffffffff748);
    core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeLockingScript>::~CLASS_FUNCTION_TABLE
              (in_stack_fffffffffffff750);
    pVar2 = std::
            map<std::__cxx11::string,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeLockingScript>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeLockingScript>>>>
            ::
            emplace<char_const(&)[11],cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeLockingScript>&>
                      ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeLockingScript>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeLockingScript>_>_>_>
                        *)in_stack_fffffffffffff760,(char (*) [11])in_stack_fffffffffffff758,
                       in_stack_fffffffffffff750);
    local_508 = (_Base_ptr)pVar2.first._M_node;
    local_500 = pVar2.second;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_528,"pegout_hex",&local_529);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)in_stack_fffffffffffff750,(value_type *)in_stack_fffffffffffff748);
    std::__cxx11::string::~string(local_528);
    std::allocator<char>::~allocator((allocator<char> *)&local_529);
    std::function<std::__cxx11::string(cfd::api::json::ElementsDecodeLockingScript_const&)>::
    function<std::__cxx11::string(&)(cfd::api::json::ElementsDecodeLockingScript_const&),void>
              ((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_cfd::api::json::ElementsDecodeLockingScript_&)>
                *)in_stack_fffffffffffff760,
               (_func_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_ElementsDecodeLockingScript_ptr
                *)in_stack_fffffffffffff758);
    std::function<void(cfd::api::json::ElementsDecodeLockingScript&,UniValue_const&)>::
    function<void(&)(cfd::api::json::ElementsDecodeLockingScript&,UniValue_const&),void>
              (in_stack_fffffffffffff760,
               (_func_void_ElementsDecodeLockingScript_ptr_UniValue_ptr *)in_stack_fffffffffffff758)
    ;
    std::function<std::__cxx11::string()>::function<std::__cxx11::string(&)(),void>
              ((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
                *)in_stack_fffffffffffff760,
               (_func_basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff758);
    core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeLockingScript>::operator=
              (in_stack_fffffffffffff750,in_stack_fffffffffffff748);
    core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeLockingScript>::~CLASS_FUNCTION_TABLE
              (in_stack_fffffffffffff750);
    pVar2 = std::
            map<std::__cxx11::string,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeLockingScript>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeLockingScript>>>>
            ::
            emplace<char_const(&)[15],cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeLockingScript>&>
                      ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeLockingScript>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeLockingScript>_>_>_>
                        *)in_stack_fffffffffffff760,in_stack_fffffffffffff758,
                       in_stack_fffffffffffff750);
    local_5a0 = (_Base_ptr)pVar2.first._M_node;
    local_598 = pVar2.second;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_5c0,"pegout_reqSigs",&local_5c1);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)in_stack_fffffffffffff750,(value_type *)in_stack_fffffffffffff748);
    std::__cxx11::string::~string(local_5c0);
    std::allocator<char>::~allocator((allocator<char> *)&local_5c1);
    std::function<std::__cxx11::string(cfd::api::json::ElementsDecodeLockingScript_const&)>::
    function<std::__cxx11::string(&)(cfd::api::json::ElementsDecodeLockingScript_const&),void>
              ((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_cfd::api::json::ElementsDecodeLockingScript_&)>
                *)in_stack_fffffffffffff760,
               (_func_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_ElementsDecodeLockingScript_ptr
                *)in_stack_fffffffffffff758);
    std::function<void(cfd::api::json::ElementsDecodeLockingScript&,UniValue_const&)>::
    function<void(&)(cfd::api::json::ElementsDecodeLockingScript&,UniValue_const&),void>
              (in_stack_fffffffffffff760,
               (_func_void_ElementsDecodeLockingScript_ptr_UniValue_ptr *)in_stack_fffffffffffff758)
    ;
    std::function<std::__cxx11::string()>::function<std::__cxx11::string(&)(),void>
              ((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
                *)in_stack_fffffffffffff760,
               (_func_basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff758);
    core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeLockingScript>::operator=
              (in_stack_fffffffffffff750,in_stack_fffffffffffff748);
    core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeLockingScript>::~CLASS_FUNCTION_TABLE
              (in_stack_fffffffffffff750);
    pVar2 = std::
            map<std::__cxx11::string,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeLockingScript>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeLockingScript>>>>
            ::
            emplace<char_const(&)[12],cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeLockingScript>&>
                      ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeLockingScript>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeLockingScript>_>_>_>
                        *)in_stack_fffffffffffff760,(char (*) [12])in_stack_fffffffffffff758,
                       in_stack_fffffffffffff750);
    local_638 = (_Base_ptr)pVar2.first._M_node;
    local_630 = pVar2.second;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_658,"pegout_type",&local_659);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)in_stack_fffffffffffff750,(value_type *)in_stack_fffffffffffff748);
    std::__cxx11::string::~string(local_658);
    std::allocator<char>::~allocator((allocator<char> *)&local_659);
    __args = (char (*) [17])local_6c0;
    std::function<std::__cxx11::string(cfd::api::json::ElementsDecodeLockingScript_const&)>::
    function<std::__cxx11::string(&)(cfd::api::json::ElementsDecodeLockingScript_const&),void>
              ((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_cfd::api::json::ElementsDecodeLockingScript_&)>
                *)in_stack_fffffffffffff760,
               (_func_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_ElementsDecodeLockingScript_ptr
                *)__args);
    std::function<void(cfd::api::json::ElementsDecodeLockingScript&,UniValue_const&)>::
    function<void(&)(cfd::api::json::ElementsDecodeLockingScript&,UniValue_const&),void>
              (in_stack_fffffffffffff760,
               (_func_void_ElementsDecodeLockingScript_ptr_UniValue_ptr *)__args);
    std::function<std::__cxx11::string()>::function<std::__cxx11::string(&)(),void>
              ((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
                *)in_stack_fffffffffffff760,
               (_func_basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__args);
    this_00 = local_60;
    core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeLockingScript>::operator=
              (in_stack_fffffffffffff750,in_stack_fffffffffffff748);
    core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeLockingScript>::~CLASS_FUNCTION_TABLE
              (in_stack_fffffffffffff750);
    pVar2 = std::
            map<std::__cxx11::string,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeLockingScript>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeLockingScript>>>>
            ::
            emplace<char_const(&)[17],cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeLockingScript>&>
                      (this_00,__args,in_stack_fffffffffffff750);
    local_6f1._33_8_ = pVar2.first._M_node;
    local_6f1[0x29] = pVar2.second;
    this = (CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeLockingScript> *)local_6f1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)(local_6f1 + 1),"pegout_addresses",(allocator *)this);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)this,(value_type *)in_stack_fffffffffffff748);
    std::__cxx11::string::~string((string *)(local_6f1 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_6f1);
    core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeLockingScript>::~CLASS_FUNCTION_TABLE
              (this);
  }
  return;
}

Assistant:

void ElementsDecodeLockingScript::CollectFieldName() {
  if (!json_mapper.empty()) {
    return;
  }
  cfd::core::CLASS_FUNCTION_TABLE<ElementsDecodeLockingScript> func_table;  // NOLINT

  func_table = {
    ElementsDecodeLockingScript::GetAsmString,
    ElementsDecodeLockingScript::SetAsmString,
    ElementsDecodeLockingScript::GetAsmFieldType,
  };
  json_mapper.emplace("asm", func_table);
  item_list.push_back("asm");
  func_table = {
    ElementsDecodeLockingScript::GetHexString,
    ElementsDecodeLockingScript::SetHexString,
    ElementsDecodeLockingScript::GetHexFieldType,
  };
  json_mapper.emplace("hex", func_table);
  item_list.push_back("hex");
  func_table = {
    ElementsDecodeLockingScript::GetReqSigsString,
    ElementsDecodeLockingScript::SetReqSigsString,
    ElementsDecodeLockingScript::GetReqSigsFieldType,
  };
  json_mapper.emplace("reqSigs", func_table);
  item_list.push_back("reqSigs");
  func_table = {
    ElementsDecodeLockingScript::GetTypeString,
    ElementsDecodeLockingScript::SetTypeString,
    ElementsDecodeLockingScript::GetTypeFieldType,
  };
  json_mapper.emplace("type", func_table);
  item_list.push_back("type");
  func_table = {
    ElementsDecodeLockingScript::GetAddressesString,
    ElementsDecodeLockingScript::SetAddressesString,
    ElementsDecodeLockingScript::GetAddressesFieldType,
  };
  json_mapper.emplace("addresses", func_table);
  item_list.push_back("addresses");
  func_table = {
    ElementsDecodeLockingScript::GetPegout_chainString,
    ElementsDecodeLockingScript::SetPegout_chainString,
    ElementsDecodeLockingScript::GetPegout_chainFieldType,
  };
  json_mapper.emplace("pegout_chain", func_table);
  item_list.push_back("pegout_chain");
  func_table = {
    ElementsDecodeLockingScript::GetPegout_asmString,
    ElementsDecodeLockingScript::SetPegout_asmString,
    ElementsDecodeLockingScript::GetPegout_asmFieldType,
  };
  json_mapper.emplace("pegout_asm", func_table);
  item_list.push_back("pegout_asm");
  func_table = {
    ElementsDecodeLockingScript::GetPegout_hexString,
    ElementsDecodeLockingScript::SetPegout_hexString,
    ElementsDecodeLockingScript::GetPegout_hexFieldType,
  };
  json_mapper.emplace("pegout_hex", func_table);
  item_list.push_back("pegout_hex");
  func_table = {
    ElementsDecodeLockingScript::GetPegout_reqSigsString,
    ElementsDecodeLockingScript::SetPegout_reqSigsString,
    ElementsDecodeLockingScript::GetPegout_reqSigsFieldType,
  };
  json_mapper.emplace("pegout_reqSigs", func_table);
  item_list.push_back("pegout_reqSigs");
  func_table = {
    ElementsDecodeLockingScript::GetPegout_typeString,
    ElementsDecodeLockingScript::SetPegout_typeString,
    ElementsDecodeLockingScript::GetPegout_typeFieldType,
  };
  json_mapper.emplace("pegout_type", func_table);
  item_list.push_back("pegout_type");
  func_table = {
    ElementsDecodeLockingScript::GetPegout_addressesString,
    ElementsDecodeLockingScript::SetPegout_addressesString,
    ElementsDecodeLockingScript::GetPegout_addressesFieldType,
  };
  json_mapper.emplace("pegout_addresses", func_table);
  item_list.push_back("pegout_addresses");
}